

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

uint nullcDebugConvertNativeAddressToInstruction(void *address)

{
  uint uVar1;
  
  if (NULLC::executorX86 == 0 || NULLC::currExec != 1) {
    return 0xffffffff;
  }
  if ((*(void **)(NULLC::executorX86 + 0x498) <= address) &&
     (address <=
      (void *)((long)*(void **)(NULLC::executorX86 + 0x498) +
              (ulong)*(uint *)(NULLC::executorX86 + 0x4a0)))) {
    uVar1 = NULLC::GetInstructionFromAddress((uintptr_t)address);
    return uVar1;
  }
  return 0xffffffff;
}

Assistant:

unsigned nullcDebugConvertNativeAddressToInstruction(void *address)
{
	using namespace NULLC;

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86 && executorX86)
		return executorX86->GetInstructionAtAddress(address);
#endif

	return ~0u;
}